

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::CenterZoomNet(BoardView *this,string *netname)

{
  element_type *peVar1;
  _func_int **pp_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__n;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  _Var7;
  shared_ptr<Component> *extraout_RAX;
  element_type *peVar8;
  float fVar11;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  float fVar12;
  float fVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  
  if ((this->config).infoPanelCenterZoomNets == true) {
    iVar5 = (*this->m_board->_vptr_Board[4])();
    _Var7._M_current = (shared_ptr<Component> *)CONCAT44(extraout_var,iVar5);
    peVar8 = ((_Var7._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar1 = (element_type *)
             ((_Var7._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    auVar14 = _DAT_001e9600;
    auVar18 = _DAT_001e9610;
    if (peVar8 != peVar1) {
      do {
        pp_Var2 = (peVar8->super_BoardElement)._vptr_BoardElement;
        _Var7._M_current = (shared_ptr<Component> *)pp_Var2[0xc];
        __n = _Var7._M_current[1].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
        if (__n == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)netname->_M_string_length) {
          if (__n != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            uVar6 = bcmp(_Var7._M_current[1].
                         super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (netname->_M_dataplus)._M_p,(size_t)__n);
            _Var7._M_current = (shared_ptr<Component> *)(ulong)uVar6;
            if (uVar6 != 0) goto LAB_0011447f;
          }
          auVar13._8_8_ = 0;
          auVar13._0_8_ = pp_Var2[10];
          auVar17._8_8_ = 0;
          auVar17._0_8_ = pp_Var2[10];
          auVar18 = minps(auVar17,auVar18);
          auVar14 = maxps(auVar13,auVar14);
          if ((((this->config).infoPanelSelectPartsOnNet == true) &&
              (*(int *)((long)pp_Var2 + 0xc) != 4)) &&
             (_Var7 = std::
                      __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Component>const>>
                                ((this->m_partHighlighted).
                                 super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (this->m_partHighlighted).
                                 super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,pp_Var2 + 0xd),
             _Var7._M_current ==
             (this->m_partHighlighted).
             super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            pp_Var2 = (peVar8->super_BoardElement)._vptr_BoardElement;
            pp_Var2[0xd][0xe0] = (code)0x1;
            std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
            push_back(&this->m_partHighlighted,(value_type *)(pp_Var2 + 0xd));
            _Var7._M_current = extraout_RAX;
          }
        }
LAB_0011447f:
        peVar8 = (element_type *)&peVar8->component_type;
      } while (peVar8 != peVar1);
    }
    fVar19 = auVar18._0_4_;
    fVar20 = auVar18._4_4_;
    auVar10._4_4_ = -(uint)(fVar20 == 3.4028235e+38);
    auVar10._0_4_ = -(uint)(fVar19 == 3.4028235e+38);
    auVar10._8_4_ = -(uint)(auVar14._0_4_ == 1.1754944e-38);
    auVar10._12_4_ = -(uint)(auVar14._4_4_ == 1.1754944e-38);
    iVar5 = movmskps((int)_Var7._M_current,auVar10);
    if (iVar5 == 0) {
      if (this->debug == true) {
        CenterZoomNet();
      }
      fVar12 = auVar14._0_4_ - fVar19;
      fVar15 = auVar14._4_4_ - fVar20;
      auVar3._4_4_ = fVar15;
      auVar3._0_4_ = fVar12;
      auVar4._8_8_ = 0;
      auVar4._0_4_ = (this->m_board_surface).x;
      auVar4._4_4_ = (this->m_board_surface).y;
      auVar3._8_4_ = auVar14._8_4_ - auVar18._8_4_;
      auVar3._12_4_ = auVar14._12_4_ - auVar18._12_4_;
      auVar14 = divps(auVar4,auVar3);
      fVar16 = (float)(~-(uint)(0.0 < fVar12) & 0x7f7fffff | auVar14._0_4_ & -(uint)(0.0 < fVar12));
      fVar11 = (float)(~-(uint)(0.0 < fVar15) & 0x7f7fffff | auVar14._4_4_ & -(uint)(0.0 < fVar15));
      if (fVar11 <= fVar16) {
        fVar16 = fVar11;
      }
      fVar11 = this->m_scale_floor;
      fVar16 = (float)(-(uint)(fVar16 == 3.4028235e+38) & (uint)fVar11 |
                      ~-(uint)(fVar16 == 3.4028235e+38) & (uint)fVar16) /
               (this->config).partZoomScaleOutFactor;
      if (fVar11 <= fVar16) {
        fVar11 = fVar16;
      }
      this->m_scale = fVar11;
      fVar16 = (this->m_board_surface).x;
      fVar11 = (this->m_board_surface).y;
      fVar19 = fVar12 * 0.5 + fVar19;
      fVar20 = fVar15 * 0.5 + fVar20;
      this->m_dx = fVar19;
      this->m_dy = fVar20;
      IVar9 = ScreenToCoord(this,fVar16 * 0.5,fVar11 * 0.5,1.0);
      this->m_dx = (IVar9.x - fVar19) + fVar19;
      this->m_dy = (IVar9.y - fVar20) + fVar20;
      this->m_needsRedraw = true;
    }
  }
  return;
}

Assistant:

void BoardView::CenterZoomNet(std::string netname) {
	ImVec2 view = m_board_surface;
	ImVec2 min, max;
	int i = 0;

	if (!config.infoPanelCenterZoomNets) return;

	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;

	for (auto &pin : m_board->Pins()) {
		if (pin->net->name == netname) {
			auto p = pin->position;
			if (p.x < min.x) min.x = p.x;
			if (p.y < min.y) min.y = p.y;
			if (p.x > max.x) max.x = p.x;
			if (p.y > max.y) max.y = p.y;

			if ((config.infoPanelSelectPartsOnNet) && (pin->type != Pin::kPinTypeTestPad)) {
				if (!contains(pin->component, m_partHighlighted)) {
					pin->component->visualmode = pin->component->CVMSelected;
					m_partHighlighted.push_back(pin->component);
				}
			}
		}
	}

	// Bounds check!
	if ((min.x == FLT_MAX) || (min.y == FLT_MAX) || (max.x == FLT_MIN) || (max.y == FLT_MIN)) return;

	if (debug) fprintf(stderr, "CenterzoomNet: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);

	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : FLT_MAX;
	float sy = dy > 0 ? view.y / dy : FLT_MAX;

	m_scale = sx < sy ? sx : sy;
	if (m_scale == FLT_MAX) m_scale = m_scale_floor;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;

	/*
	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	//  m_rotation = 0;
	m_scale = sx < sy ? sx : sy;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;
	*/

	m_dx = (max.x - min.x) / 2 + min.x;
	m_dy = (max.y - min.y) / 2 + min.y;
	SetTarget(m_dx, m_dy);
	m_needsRedraw = true;
}